

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3_update_hook(sqlite3 *db,
                          _func_void_void_ptr_int_char_ptr_char_ptr_sqlite_int64 *xCallback,
                          void *pArg)

{
  void *pvVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  void *pRet;
  
  sqlite3_mutex_enter((sqlite3_mutex *)0x14c594);
  pvVar1 = *(void **)(in_RDI + 0x130);
  *(undefined8 *)(in_RDI + 0x138) = in_RSI;
  *(undefined8 *)(in_RDI + 0x130) = in_RDX;
  sqlite3_mutex_leave((sqlite3_mutex *)0x14c5d5);
  return pvVar1;
}

Assistant:

SQLITE_API void *sqlite3_update_hook(
  sqlite3 *db,              /* Attach the hook to this database */
  void (*xCallback)(void*,int,char const *,char const *,sqlite_int64),
  void *pArg                /* Argument to the function */
){
  void *pRet;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  pRet = db->pUpdateArg;
  db->xUpdateCallback = xCallback;
  db->pUpdateArg = pArg;
  sqlite3_mutex_leave(db->mutex);
  return pRet;
}